

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileMtlImporter::getColorRGBA(ObjFileMtlImporter *this,aiColor3D *pColor)

{
  bool bVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  reference pcVar3;
  ai_real local_24;
  ai_real local_20;
  ai_real b;
  ai_real g;
  ai_real r;
  aiColor3D *pColor_local;
  ObjFileMtlImporter *this_local;
  
  _g = pColor;
  pColor_local = (aiColor3D *)this;
  if (pColor != (aiColor3D *)0x0) {
    b = 0.0;
    local_20 = 0.0;
    local_24 = 0.0;
    _Var2 = getFloat<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&b);
    (this->m_DataIt)._M_current = _Var2._M_current;
    _g->r = b;
    pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    bVar1 = IsLineEnd<char>(*pcVar3);
    if (!bVar1) {
      _Var2 = getFloat<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&local_20);
      (this->m_DataIt)._M_current = _Var2._M_current;
      _Var2 = getFloat<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&local_24);
      (this->m_DataIt)._M_current = _Var2._M_current;
    }
    _g->g = local_20;
    _g->b = local_24;
    return;
  }
  __assert_fail("__null != pColor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileMtlImporter.cpp"
                ,0xf2,"void Assimp::ObjFileMtlImporter::getColorRGBA(aiColor3D *)");
}

Assistant:

void ObjFileMtlImporter::getColorRGBA( aiColor3D *pColor )
{
    ai_assert( NULL != pColor );

    ai_real r( 0.0 ), g( 0.0 ), b( 0.0 );
    m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, r );
    pColor->r = r;

    // we have to check if color is default 0 with only one token
    if( !IsLineEnd( *m_DataIt ) ) {
        m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, g );
        m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, b );
    }
    pColor->g = g;
    pColor->b = b;
}